

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void real_suite::run(void)

{
  test_zero();
  test_one();
  test_minus_one();
  test_half();
  test_one_exp_one();
  test_one_upper_exp_one();
  test_one_dot_exp_one();
  test_one_exp_plus_one();
  test_one_exp_minus_one();
  fail_missing_fraction();
  fail_missing_fraction_white();
  fail_missing_exponent();
  fail_missing_fraction_white();
  fail_missing_exponent_plus();
  fail_missing_exponent_plus_white();
  fail_missing_exponent_minus();
  fail_missing_exponent_minus_white();
  fail_zero_followed_by_digits();
  fail_as_int();
  fail_as_string();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_half();
    test_one_exp_one();
    test_one_upper_exp_one();
    test_one_dot_exp_one();
    test_one_exp_plus_one();
    test_one_exp_minus_one();
    fail_missing_fraction();
    fail_missing_fraction_white();
    fail_missing_exponent();
    fail_missing_fraction_white();
    fail_missing_exponent_plus();
    fail_missing_exponent_plus_white();
    fail_missing_exponent_minus();
    fail_missing_exponent_minus_white();
    fail_zero_followed_by_digits();
    fail_as_int();
    fail_as_string();
}